

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O1

void __thiscall
lsim::Simulator::write_node(Simulator *this,node_t node_id,Value value,pin_t from_pin)

{
  pointer pNVar1;
  iterator __position;
  ulong uVar2;
  pair<std::_Rb_tree_iterator<unsigned_int>,_std::_Rb_tree_iterator<unsigned_int>_> pVar3;
  pin_t local_20;
  node_t local_1c;
  
  uVar2 = (ulong)node_id;
  local_20 = from_pin;
  local_1c = node_id;
  if (uVar2 < (ulong)((long)(this->m_node_values_write).
                            super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->m_node_values_write).
                            super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2)) {
    pNVar1 = (this->m_node_metadata).
             super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pNVar1[uVar2].m_time_dirty_write != this->m_time) {
      __position._M_current =
           (this->m_dirty_nodes_write).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_dirty_nodes_write).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_dirty_nodes_write,
                   __position,&local_1c);
      }
      else {
        *__position._M_current = node_id;
        (this->m_dirty_nodes_write).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pNVar1[uVar2].m_time_dirty_write = this->m_time;
    }
    if (value == VALUE_UNDEFINED) {
      pVar3 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::equal_range(&pNVar1[uVar2].m_active_pins._M_t,&local_20);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase_aux(&pNVar1[uVar2].m_active_pins._M_t,(_Base_ptr)pVar3.first._M_node,
                     (_Base_ptr)pVar3.second._M_node);
    }
    else {
      (this->m_node_write_time).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[local_1c] = this->m_time;
      (this->m_node_values_write).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
      _M_impl.super__Vector_impl_data._M_start[local_1c] = value;
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&pNVar1[uVar2].m_active_pins,&local_20);
    }
    return;
  }
  __assert_fail("node_id < m_node_values_write.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0xd8,"void lsim::Simulator::write_node(node_t, Value, pin_t)");
}

Assistant:

void Simulator::write_node(node_t node_id, Value value, pin_t from_pin) {
    assert(node_id < m_node_values_write.size());
	auto &node_meta = m_node_metadata[node_id];

	if (node_meta.m_time_dirty_write != m_time) {
		m_dirty_nodes_write.push_back(node_id);
		node_meta.m_time_dirty_write = m_time;
	}

    if (value == VALUE_UNDEFINED) {
        // remove from active pin list
		node_meta.m_active_pins.erase(from_pin);
        return;
    }

    m_node_write_time[node_id] = m_time;
    m_node_values_write[node_id] = value;
    node_meta.m_active_pins.insert(from_pin);
}